

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_mt.cpp
# Opt level: O0

void do_work(void)

{
  allocator<char> *__a;
  string *file;
  reference pvVar1;
  ostream *poVar2;
  inline_timer *in_stack_00000028;
  ostream *in_stack_00000030;
  int i;
  value_type *in_stack_fffffffffffffe18;
  inline_timer *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  string *function;
  size_t in_stack_fffffffffffffe30;
  duration<long,std::ratio<1l,1000l>> *this;
  string *in_stack_fffffffffffffe38;
  inline_timer *in_stack_fffffffffffffe40;
  inline_timer *this_00;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  duration<long,std::ratio<1l,1000l>> local_198 [8];
  int local_190;
  undefined1 local_189 [40];
  undefined1 local_161 [141];
  int local_d4;
  duration<long,std::ratio<1l,1000l>> local_d0 [15];
  allocator<char> local_c1;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [136];
  
  __a = (allocator<char> *)perf::inline_timer_stack();
  __s = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(char *)__s,__a);
  perf::inline_timer::inline_timer
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  push((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
        *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  perf::inline_timer::~inline_timer(in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x104641);
  perf::inline_timer::start(in_stack_fffffffffffffe20);
  local_d4 = 0x14;
  this = local_d0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(this,&local_d4);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
  file = (string *)perf::inline_timer_stack();
  this_00 = (inline_timer *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(char *)__s,__a);
  function = (string *)local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(char *)__s,__a);
  perf::inline_timer::inline_timer(this_00,file,(size_t)this,function);
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  push((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
        *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  perf::inline_timer::~inline_timer(in_stack_fffffffffffffe20);
  std::__cxx11::string::~string((string *)(local_189 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_189);
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x104753);
  perf::inline_timer::start(in_stack_fffffffffffffe20);
  for (local_190 = 0; local_190 < 10; local_190 = local_190 + 1) {
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_198,(int *)&stack0xfffffffffffffe64);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
  }
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x1048db);
  perf::inline_timer::stop(in_stack_fffffffffffffe20);
  perf::inline_timer_stack();
  pvVar1 = std::
           stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
           ::top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
                  *)0x1048f0);
  perf::inline_timer::set_last_line(pvVar1,0x2c);
  perf::inline_out_ptr();
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x104913);
  poVar2 = perf::operator<<(in_stack_00000030,in_stack_00000028);
  std::operator<<(poVar2,'\n');
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  pop((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x104939);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x104946);
  perf::inline_timer::stop(in_stack_fffffffffffffe20);
  perf::inline_timer_stack();
  pvVar1 = std::
           stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
           ::top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
                  *)0x10495b);
  perf::inline_timer::set_last_line(pvVar1,0x2e);
  perf::inline_out_ptr();
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x10497f);
  poVar2 = perf::operator<<(in_stack_00000030,in_stack_00000028);
  std::operator<<(poVar2,'\n');
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  pop((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x1049a6);
  return;
}

Assistant:

void do_work()
{
    PERF_START();
    std::this_thread::sleep_for(perf::milliseconds(20));

    PERF_START();
    for (int i = 0; i < 10; i++)
    {
        std::this_thread::sleep_for(perf::milliseconds(20));
    }
    PERF_STOP();

    PERF_STOP();
}